

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_cjson.c
# Opt level: O0

void json_append_number(lua_State *l,json_config_t *cfg,strbuf_t *json,int lindex)

{
  int iVar1;
  int iVar2;
  char *str;
  lua_Number num_00;
  int len;
  double num;
  int lindex_local;
  strbuf_t *json_local;
  json_config_t *cfg_local;
  lua_State *l_local;
  
  num_00 = lua_tonumberx(l,lindex,(int *)0x0);
  if (cfg->encode_invalid_numbers == 0) {
    iVar2 = 1;
    if ((long)num_00 < 0) {
      iVar2 = -1;
    }
    iVar1 = 0;
    if (ABS(num_00) == INFINITY) {
      iVar1 = iVar2;
    }
    if ((iVar1 != 0) || (NAN(num_00))) {
      json_encode_exception(l,cfg,json,lindex,"must not be NaN or Infinity");
    }
  }
  else if (cfg->encode_invalid_numbers == 1) {
    if (NAN(num_00)) {
      strbuf_append_mem(json,"NaN",3);
      return;
    }
    iVar2 = 1;
    if ((long)num_00 < 0) {
      iVar2 = -1;
    }
    iVar1 = 0;
    if (ABS(num_00) == INFINITY) {
      iVar1 = iVar2;
    }
    if (iVar1 != 0) {
      if (num_00 < 0.0) {
        strbuf_append_mem(json,"-Infinity",9);
        return;
      }
      strbuf_append_mem(json,"Infinity",8);
      return;
    }
  }
  else {
    iVar2 = 1;
    if ((long)num_00 < 0) {
      iVar2 = -1;
    }
    iVar1 = 0;
    if (ABS(num_00) == INFINITY) {
      iVar1 = iVar2;
    }
    if ((iVar1 != 0) || (NAN(num_00))) {
      strbuf_append_mem(json,"null",4);
      return;
    }
  }
  strbuf_ensure_empty_length(json,0x20);
  str = strbuf_empty_ptr(json);
  iVar2 = fpconv_g_fmt(str,num_00,cfg->encode_number_precision);
  strbuf_extend_length(json,iVar2);
  return;
}

Assistant:

static void json_append_number(lua_State *l, json_config_t *cfg,
                               strbuf_t *json, int lindex)
{
    double num = lua_tonumber(l, lindex);
    int len;

    if (cfg->encode_invalid_numbers == 0) {
        /* Prevent encoding invalid numbers */
        if (isinf(num) || isnan(num))
            json_encode_exception(l, cfg, json, lindex,
                                  "must not be NaN or Infinity");
    } else if (cfg->encode_invalid_numbers == 1) {
        /* Encode NaN/Infinity separately to ensure Javascript compatible
         * values are used. */
        if (isnan(num)) {
            strbuf_append_mem(json, "NaN", 3);
            return;
        }
        if (isinf(num)) {
            if (num < 0)
                strbuf_append_mem(json, "-Infinity", 9);
            else
                strbuf_append_mem(json, "Infinity", 8);
            return;
        }
    } else {
        /* Encode invalid numbers as "null" */
        if (isinf(num) || isnan(num)) {
            strbuf_append_mem(json, "null", 4);
            return;
        }
    }

    strbuf_ensure_empty_length(json, FPCONV_G_FMT_BUFSIZE);
    len = fpconv_g_fmt(strbuf_empty_ptr(json), num, cfg->encode_number_precision);
    strbuf_extend_length(json, len);
}